

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.h
# Opt level: O0

void __thiscall cmComputeLinkDepends::LinkEntry::LinkEntry(LinkEntry *this)

{
  cmListFileBacktrace local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  LinkEntry *local_10;
  LinkEntry *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)&local_30);
  local_48.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_48.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmListFileBacktrace::cmListFileBacktrace(&local_48);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&this->Item,&local_30,&local_48);
  cmListFileBacktrace::~cmListFileBacktrace(&local_48);
  std::__cxx11::string::~string((string *)&local_30);
  this->Target = (cmGeneratorTarget *)0x0;
  this->ObjectSource = (cmSourceFile *)0x0;
  this->Kind = Library;
  std::__cxx11::string::string((string *)&this->Feature,(string *)&cmLinkItem::DEFAULT_abi_cxx11_);
  return;
}

Assistant:

LinkEntry() = default;